

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O3

S2LatLngRect * S2LatLngRect::FromPoint(S2LatLngRect *__return_storage_ptr__,S2LatLng *p)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  S2LogMessage SStack_28;
  
  auVar1._8_8_ = -(ulong)(ABS((p->coords_).c_[1]) <= 3.141592653589793);
  auVar1._0_8_ = -(ulong)(ABS((p->coords_).c_[0]) <= 1.5707963267948966);
  iVar2 = movmskpd(in_EAX,auVar1);
  if (iVar2 != 3) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x2e,kError,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Invalid S2LatLng in S2LatLngRect::GetDistance: ",0x2f);
    ::operator<<(SStack_28.stream_,p);
    S2LogMessage::~S2LogMessage(&SStack_28);
  }
  S2LatLngRect(__return_storage_ptr__,p,p);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2LatLngRect::FromPoint(const S2LatLng& p) {
  S2_DLOG_IF(ERROR, !p.is_valid())
      << "Invalid S2LatLng in S2LatLngRect::GetDistance: " << p;

  return S2LatLngRect(p, p);
}